

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void compareComponent(ComponentPtr *c1,ComponentPtr *c2,EntityPtr *expectedParent)

{
  shared_ptr *psVar1;
  long lVar2;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *__r;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  AssertionResult gtest_ar;
  ComponentPtr c2i;
  AssertionResult gtest_ar_2;
  AssertHelper local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *local_48;
  Message local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  libcellml::NamedEntity::name_abi_cxx11_();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"c1->name()","c2->name()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2i);
  std::__cxx11::string::~string((string *)&c2i);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c2i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x162,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&c2i,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c2i);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"c1->id()","c2->id()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2i);
  std::__cxx11::string::~string((string *)&c2i);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c2i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x163,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&c2i,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c2i);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar3 = libcellml::ImportedEntity::isImport();
  c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _1_7_,uVar3);
  bVar4 = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar.success_ = bVar4;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_2,"c1->isImport()","c2->isImport()",(bool *)&c2i,
             &gtest_ar.success_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&c2i);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x164,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&c2i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&c2i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cVar5 = libcellml::ImportedEntity::isImport();
  if (cVar5 != '\0') {
    cVar5 = libcellml::ImportedEntity::isImport();
    if (cVar5 != '\0') {
      libcellml::ImportedEntity::importSource();
      libcellml::ImportSource::url_abi_cxx11_();
      libcellml::ImportedEntity::importSource();
      libcellml::ImportSource::url_abi_cxx11_();
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"c1->importSource()->url()","c2->importSource()->url()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2i);
      std::__cxx11::string::~string((string *)&c2i);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&c2i,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x166,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&c2i,(Message *)&gtest_ar_2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c2i);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      libcellml::ImportedEntity::importSource();
      libcellml::Entity::id_abi_cxx11_();
      libcellml::ImportedEntity::importSource();
      libcellml::Entity::id_abi_cxx11_();
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"c1->importSource()->id()","c2->importSource()->id()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2i);
      std::__cxx11::string::~string((string *)&c2i);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&c2i,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x167,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&c2i,(Message *)&gtest_ar_2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c2i);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"c1->importReference()","c2->importReference()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c2i);
  std::__cxx11::string::~string((string *)&c2i);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c2i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x169,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&c2i,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c2i);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::ComponentEntity::componentCount();
  gtest_ar._0_8_ = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"c1->componentCount()","c2->componentCount()",
             (unsigned_long *)&c2i,(unsigned_long *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&c2i);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&c2i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&c2i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Component::resetCount();
  gtest_ar._0_8_ = libcellml::Component::resetCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"c1->resetCount()","c2->resetCount()",(unsigned_long *)&c2i,
             (unsigned_long *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&c2i);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&c2i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&c2i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Component::variableCount();
  gtest_ar._0_8_ = libcellml::Component::variableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"c1->variableCount()","c2->variableCount()",
             (unsigned_long *)&c2i,(unsigned_long *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&c2i);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&c2i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&c2i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  libcellml::ParentedEntity::parent();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Entity>,std::shared_ptr<libcellml::ParentedEntity>>
            ((internal *)&gtest_ar_2,"expectedParent","c2->parent()",expectedParent,
             (shared_ptr<libcellml::ParentedEntity> *)&c2i);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&c2i);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&c2i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&c2i);
  }
  local_48 = &c2->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  uVar7 = 0;
  while( true ) {
    uVar6 = libcellml::ComponentEntity::componentCount();
    if (uVar6 <= uVar7) break;
    libcellml::ComponentEntity::component((ulong)&gtest_ar_2);
    __r = local_48;
    libcellml::ComponentEntity::component((ulong)&c2i);
    std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>
              ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,__r);
    compareComponent((ComponentPtr *)&gtest_ar_2,&c2i,(EntityPtr *)&gtest_ar);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    uVar6 = libcellml::Component::resetCount();
    if (uVar6 <= uVar7) break;
    libcellml::Component::reset((ulong)&c2i);
    libcellml::Reset::variable();
    lVar2 = CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
    if (lVar2 != 0) {
      psVar1 = (shared_ptr *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&local_48->_M_ptr)
               ->_M_ptr;
      libcellml::Reset::variable();
      bVar4 = (bool)libcellml::Component::hasVariable(psVar1);
      gtest_ar.success_ = bVar4;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(local_40);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&gtest_ar_2,&gtest_ar.success_,"c2->hasVariable(r->variable())","false");
        testing::internal::AssertHelper::AssertHelper
                  (local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x178,(char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
        testing::internal::AssertHelper::operator=(local_58,local_40);
        testing::internal::AssertHelper::~AssertHelper(local_58);
        std::__cxx11::string::~string((string *)&gtest_ar_2);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    libcellml::Reset::testVariable();
    lVar2 = CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
    if (lVar2 != 0) {
      psVar1 = (shared_ptr *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&local_48->_M_ptr)
               ->_M_ptr;
      libcellml::Reset::testVariable();
      bVar4 = (bool)libcellml::Component::hasVariable(psVar1);
      gtest_ar.success_ = bVar4;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(local_40);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&gtest_ar_2,&gtest_ar.success_,"c2->hasVariable(r->testVariable())","false");
        testing::internal::AssertHelper::AssertHelper
                  (local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x17b,(char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
        testing::internal::AssertHelper::operator=(local_58,local_40);
        testing::internal::AssertHelper::~AssertHelper(local_58);
        std::__cxx11::string::~string((string *)&gtest_ar_2);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void compareComponent(const libcellml::ComponentPtr &c1, const libcellml::ComponentPtr &c2, const libcellml::EntityPtr &expectedParent)
{
    EXPECT_EQ(c1->name(), c2->name());
    EXPECT_EQ(c1->id(), c2->id());
    EXPECT_EQ(c1->isImport(), c2->isImport());
    if (c1->isImport() && c2->isImport()) {
        EXPECT_EQ(c1->importSource()->url(), c2->importSource()->url());
        EXPECT_EQ(c1->importSource()->id(), c2->importSource()->id());
    }
    EXPECT_EQ(c1->importReference(), c2->importReference());
    EXPECT_EQ(c1->componentCount(), c2->componentCount());
    EXPECT_EQ(c1->resetCount(), c2->resetCount());
    EXPECT_EQ(c1->variableCount(), c2->variableCount());

    EXPECT_EQ(expectedParent, c2->parent());

    for (size_t index = 0; index < c1->componentCount(); ++index) {
        auto c1i = c1->component(index);
        auto c2i = c2->component(index);
        compareComponent(c1i, c2i, c2);
    }
    for (size_t index = 0; index < c2->resetCount(); ++index) {
        auto r = c2->reset(index);
        if (r->variable() != nullptr) {
            EXPECT_TRUE(c2->hasVariable(r->variable()));
        }
        if (r->testVariable() != nullptr) {
            EXPECT_TRUE(c2->hasVariable(r->testVariable()));
        }
    }
}